

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O0

int lib::math::Log(State *state)

{
  bool bVar1;
  int iVar2;
  State *in_RDI;
  double dVar3;
  StackAPI *this;
  double b;
  double l;
  StackAPI api;
  undefined4 in_stack_ffffffffffffffc8;
  ValueT in_stack_ffffffffffffffcc;
  StackAPI *in_stack_ffffffffffffffd0;
  StackAPI *in_stack_ffffffffffffffd8;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>
                    (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                     (ValueT)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (bVar1) {
    dVar3 = luna::StackAPI::GetNumber
                      (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    this = (StackAPI *)log(dVar3);
    iVar2 = luna::StackAPI::GetStackSize(in_stack_ffffffffffffffd0);
    if (1 < iVar2) {
      dVar3 = luna::StackAPI::GetNumber(this,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      in_stack_ffffffffffffffd0 = (StackAPI *)log(dVar3);
    }
    luna::StackAPI::PushNumber
              (in_stack_ffffffffffffffd0,
               (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Log(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto l = std::log(api.GetNumber(0));
        if (api.GetStackSize() > 1)
        {
            auto b = std::log(api.GetNumber(1));
            l /= b;
        }

        api.PushNumber(l);
        return 1;
    }